

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::SetDefaultCarIcaoType(DataRefs *this,string *type)

{
  logLevelTy lVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  lVar2 = std::__cxx11::string::length();
  if ((lVar2 != 0) && (uVar3 = std::__cxx11::string::length(), uVar3 < 5)) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x838),in_RSI);
    std::__cxx11::string::c_str();
    XPMPSetDefaultPlaneICAO(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    lVar1 = GetLogLevel(&dataRefs);
    if ((int)lVar1 < 2) {
      uVar4 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x99d,"SetDefaultCarIcaoType",logINFO,"Default car type is \'%s\'",uVar4);
    }
    return true;
  }
  lVar1 = GetLogLevel(&dataRefs);
  if ((int)lVar1 < 3) {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
           ,0x9a3,"SetDefaultCarIcaoType",logWARN,
           "Car default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!"
           ,uVar4,uVar5);
  }
  return false;
}

Assistant:

bool DataRefs::SetDefaultCarIcaoType(const std::string type)
{
    if (1 <= type.length() && type.length() <= 4) {
        sDefaultCarIcaoType = type;
        XPMPSetDefaultPlaneICAO(nullptr, type.c_str());  // inform libxplanemp
        LOG_MSG(logINFO,CFG_DEFAULT_CAR_TYP_INFO,sDefaultCarIcaoType.c_str());
        return true;
    }
    
    // invalid
    LOG_MSG(logWARN,ERR_CFG_CAR_DEFAULT,type.c_str(),
            sDefaultCarIcaoType.c_str());
    return false;
}